

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbformat.cc
# Opt level: O3

void __thiscall
leveldb::InternalKeyComparator::FindShortestSeparator
          (InternalKeyComparator *this,string *start,Slice *limit)

{
  int iVar1;
  ulong uVar2;
  long in_FS_OFFSET;
  Slice user_limit;
  Slice user_start;
  string tmp;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_88;
  size_type sStack_80;
  char *local_78;
  long local_70;
  pointer local_68;
  ulong local_60;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (7 < start->_M_string_length) {
    local_68 = (start->_M_dataplus)._M_p;
    uVar2 = start->_M_string_length - 8;
    local_60 = uVar2;
    if (7 < limit->size_) {
      local_78 = limit->data_;
      local_70 = limit->size_ - 8;
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,local_68,local_68 + uVar2)
      ;
      (*this->user_comparator_->_vptr_Comparator[4])(this->user_comparator_,&local_58,&local_78);
      if (CONCAT44(local_58._M_string_length._4_4_,(undefined4)local_58._M_string_length) < uVar2) {
        local_88 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)local_58._M_dataplus._M_p;
        iVar1 = (*this->user_comparator_->_vptr_Comparator[2])(this->user_comparator_,&local_68);
        if (iVar1 < 0) {
          PutFixed64(&local_58,0xffffffffffffff01);
          local_88 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)(start->_M_dataplus)._M_p;
          sStack_80 = start->_M_string_length;
          iVar1 = (*(this->super_Comparator)._vptr_Comparator[2])(this);
          if (-1 < iVar1) {
            __assert_fail("this->Compare(*start, tmp) < 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/leveldb/db/dbformat.cc"
                          ,0x4f,
                          "virtual void leveldb::InternalKeyComparator::FindShortestSeparator(std::string *, const Slice &) const"
                         );
          }
          local_88 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)local_58._M_dataplus._M_p;
          iVar1 = (*(this->super_Comparator)._vptr_Comparator[2])(this,&local_88,limit);
          if (-1 < iVar1) {
            __assert_fail("this->Compare(tmp, limit) < 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/leveldb/db/dbformat.cc"
                          ,0x50,
                          "virtual void leveldb::InternalKeyComparator::FindShortestSeparator(std::string *, const Slice &) const"
                         );
          }
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::swap
                    (start,&local_58);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return;
      }
      __stack_chk_fail();
    }
  }
  __assert_fail("internal_key.size() >= 8",
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/leveldb/db/dbformat.h"
                ,0x60,"Slice leveldb::ExtractUserKey(const Slice &)");
}

Assistant:

void InternalKeyComparator::FindShortestSeparator(std::string* start,
                                                  const Slice& limit) const {
  // Attempt to shorten the user portion of the key
  Slice user_start = ExtractUserKey(*start);
  Slice user_limit = ExtractUserKey(limit);
  std::string tmp(user_start.data(), user_start.size());
  user_comparator_->FindShortestSeparator(&tmp, user_limit);
  if (tmp.size() < user_start.size() &&
      user_comparator_->Compare(user_start, tmp) < 0) {
    // User key has become shorter physically, but larger logically.
    // Tack on the earliest possible number to the shortened user key.
    PutFixed64(&tmp,
               PackSequenceAndType(kMaxSequenceNumber, kValueTypeForSeek));
    assert(this->Compare(*start, tmp) < 0);
    assert(this->Compare(tmp, limit) < 0);
    start->swap(tmp);
  }
}